

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reject.cpp
# Opt level: O0

void __thiscall tst_helpers_reject::rejectWithQSharedPtr(tst_helpers_reject *this)

{
  bool bVar1;
  bool local_80;
  bool local_7f;
  bool local_7e;
  bool local_7d;
  int local_7c;
  QSharedPointer<int> local_78;
  QSharedPointer<int> local_68;
  undefined1 local_58 [8];
  QPromise<int> p;
  int local_34;
  undefined1 local_30 [8];
  QSharedPointer<int> sptr;
  QWeakPointer<int> wptr;
  tst_helpers_reject *this_local;
  
  QWeakPointer<int>::QWeakPointer((QWeakPointer<int> *)&sptr.d);
  local_34 = 0x2a;
  QSharedPointer<int>::create<int>((QSharedPointer<int> *)local_30,&local_34);
  QtPromise::QPromiseBase<int>::reject<QSharedPointer<int>&>
            ((QPromiseBase<int> *)local_58,(QSharedPointer<int> *)local_30);
  QSharedPointer<int>::QSharedPointer(&local_78);
  waitForError<int,QSharedPointer<int>>((QPromise<int> *)&local_68,(QSharedPointer<int> *)local_58);
  bVar1 = QTest::qCompare<QSharedPointer<int>,QSharedPointer<int>>
                    (&local_68,(QSharedPointer<int> *)local_30,
                     "waitForError(p, QSharedPointer<int>{})","sptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reject.cpp"
                     ,0x2d);
  QSharedPointer<int>::~QSharedPointer(&local_68);
  QSharedPointer<int>::~QSharedPointer(&local_78);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QWeakPointer<int>::operator=((QWeakPointer<int> *)&sptr.d,(QSharedPointer<int> *)local_30);
    QSharedPointer<int>::reset((QSharedPointer<int> *)local_30);
    local_7d = QWeakPointer<int>::isNull((QWeakPointer<int> *)&sptr.d);
    local_7e = false;
    bVar1 = QTest::qCompare<bool,bool>
                      (&local_7d,&local_7e,"wptr.isNull()","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reject.cpp"
                       ,0x32);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_7c = 0;
    }
    else {
      local_7c = 1;
    }
  }
  else {
    local_7c = 1;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_58);
  QSharedPointer<int>::~QSharedPointer((QSharedPointer<int> *)local_30);
  if (local_7c == 0) {
    local_7f = QWeakPointer<int>::isNull((QWeakPointer<int> *)&sptr.d);
    local_80 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (&local_7f,&local_80,"wptr.isNull()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reject.cpp"
                       ,0x35);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_7c = 0;
    }
    else {
      local_7c = 1;
    }
  }
  QWeakPointer<int>::~QWeakPointer((QWeakPointer<int> *)&sptr.d);
  return;
}

Assistant:

void tst_helpers_reject::rejectWithQSharedPtr()
{
    QWeakPointer<int> wptr;

    {
        auto sptr = QSharedPointer<int>::create(42);
        auto p = QtPromise::QPromise<int>::reject(sptr);

        QCOMPARE(waitForError(p, QSharedPointer<int>{}), sptr);

        wptr = sptr;
        sptr.reset();

        QCOMPARE(wptr.isNull(), false); // "p" still holds a reference
    }

    QCOMPARE(wptr.isNull(), true);
}